

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::IndexingTestUniformSetup::setup
          (IndexingTestUniformSetup *this,ShaderRenderCaseInstance *instance,Vec4 *constCoords)

{
  TestError *this_00;
  long lVar1;
  undefined8 local_b8;
  float local_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  Vector<float,_3> local_88;
  Vec4 arr [4];
  
  ShaderRenderCaseInstance::useUniform(instance,0,UI_ZERO);
  ShaderRenderCaseInstance::useUniform(instance,1,UI_ONE);
  ShaderRenderCaseInstance::useUniform(instance,2,UI_TWO);
  ShaderRenderCaseInstance::useUniform(instance,3,UI_THREE);
  ShaderRenderCaseInstance::useUniform(instance,4,UI_FOUR);
  if (this->m_usesArray == true) {
    lVar1 = 0;
    do {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)arr[0].m_data + lVar1));
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x40);
    switch(this->m_varType) {
    case TYPE_FLOAT:
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_a8,constCoords->m_data[0]);
      arr[0].m_data[1] = (float)local_a8._4_4_;
      arr[0].m_data[0] = (float)local_a8._0_4_;
      arr[0].m_data[3] = fStack_9c;
      arr[0].m_data[2] = fStack_a0;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_a8,constCoords->m_data[0] * 0.5);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_a8,constCoords->m_data[0] * 0.25);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_a8,constCoords->m_data[0] * 0.125);
      break;
    case TYPE_FLOAT_VEC2:
      local_b8 = *(undefined8 *)constCoords->m_data;
      tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)local_a8);
      arr[0].m_data[1] = (float)local_a8._4_4_;
      arr[0].m_data[0] = (float)local_a8._0_4_;
      arr[0].m_data[3] = fStack_9c;
      arr[0].m_data[2] = fStack_a0;
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      tcu::operator*(0.5,(Vector<float,_2> *)&local_88);
      tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)local_a8);
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      tcu::operator*(0.25,(Vector<float,_2> *)&local_88);
      tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)local_a8);
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      tcu::operator*(0.125,(Vector<float,_2> *)&local_88);
      tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)local_a8);
      break;
    case TYPE_FLOAT_VEC3:
      local_b0 = constCoords->m_data[2];
      local_b8 = *(undefined8 *)constCoords->m_data;
      tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)local_a8);
      arr[0].m_data[1] = (float)local_a8._4_4_;
      arr[0].m_data[0] = (float)local_a8._0_4_;
      arr[0].m_data[3] = fStack_9c;
      arr[0].m_data[2] = fStack_a0;
      local_88.m_data[2] = constCoords->m_data[2];
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      tcu::operator*((tcu *)&local_b8,0.5,&local_88);
      tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)local_a8);
      local_88.m_data[2] = constCoords->m_data[2];
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      tcu::operator*((tcu *)&local_b8,0.25,&local_88);
      tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)local_a8);
      local_88.m_data[2] = constCoords->m_data[2];
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      tcu::operator*((tcu *)&local_b8,0.125,&local_88);
      tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)local_a8);
      break;
    case TYPE_FLOAT_VEC4:
      arr[0].m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      arr[0].m_data._8_8_ = *(undefined8 *)(constCoords->m_data + 2);
      tcu::operator*((tcu *)local_a8,0.5,constCoords);
      tcu::operator*((tcu *)local_a8,0.25,constCoords);
      tcu::operator*((tcu *)local_a8,0.125,constCoords);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a8,"invalid data type for u_arr",(allocator<char> *)&local_b8);
      tcu::TestError::TestError(this_00,(string *)local_a8);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    ShaderRenderCaseInstance::addUniform(instance,5,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x40,arr);
  }
  return;
}

Assistant:

void IndexingTestUniformSetup::setup (ShaderRenderCaseInstance& instance, const tcu::Vec4& constCoords) const
{
	instance.useUniform(0u, UI_ZERO);
	instance.useUniform(1u, UI_ONE);
	instance.useUniform(2u, UI_TWO);
	instance.useUniform(3u, UI_THREE);
	instance.useUniform(4u, UI_FOUR);

	if (m_usesArray)
	{
		Vec4 arr[4];
		if (m_varType == TYPE_FLOAT)
		{
			arr[0] = Vec4(constCoords.x());
			arr[1] = Vec4(constCoords.x() * 0.5f);
			arr[2] = Vec4(constCoords.x() * 0.25f);
			arr[3] = Vec4(constCoords.x() * 0.125f);
		}
		else if (m_varType == TYPE_FLOAT_VEC2)
		{
			arr[0] = constCoords.swizzle(0, 1).toWidth<4>();
			arr[1] = (constCoords.swizzle(0, 1) * 0.5f).toWidth<4>();
			arr[2] = (constCoords.swizzle(0, 1) * 0.25f).toWidth<4>();
			arr[3] = (constCoords.swizzle(0, 1) * 0.125f).toWidth<4>();
		}
		else if (m_varType == TYPE_FLOAT_VEC3)
		{
			arr[0] = constCoords.swizzle(0, 1, 2).toWidth<4>();
			arr[1] = (constCoords.swizzle(0, 1, 2) * 0.5f).toWidth<4>();
			arr[2] = (constCoords.swizzle(0, 1, 2) * 0.25f).toWidth<4>();
			arr[3] = (constCoords.swizzle(0, 1, 2) * 0.125f).toWidth<4>();
		}
		else if (m_varType == TYPE_FLOAT_VEC4)
		{
			arr[0] = constCoords;
			arr[1] = constCoords * 0.5f;
			arr[2] = constCoords * 0.25f;
			arr[3] = constCoords * 0.125f;
		}
		else
			throw tcu::TestError("invalid data type for u_arr");

			instance.addUniform(5u, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, sizeof(Vec4) * 4, arr[0].getPtr());
	}
}